

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_>::Read
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_> *this,TPZStream *buf,void *context
          )

{
  int iVar1;
  int classid;
  int local_1c;
  
  TPZIntelGen<pzshape::TPZShapeTetra>::Read((TPZIntelGen<pzshape::TPZShapeTetra> *)this,buf,context)
  ;
  TPZStream::Read<128>(buf,&(this->fIntPtIndices).super_TPZManVector<long,_128>);
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_1c,1);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeTetra>).
                                 super_TPZIntelGen<pzshape::TPZShapeTetra>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(this);
  if (local_1c != iVar1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcompelwithmem.h"
               ,0x136);
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::Read(TPZStream &buf, void *context)
{
    TBASE::Read(buf,context);
    buf.Read( fIntPtIndices);
    int classid;
    buf.Read(&classid);
    if (classid != ClassId()) {
        DebugStop();
    }
}